

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacNtk.c
# Opt level: O3

void Bac_NtkDeriveFanout(Bac_Ntk_t *p)

{
  Vec_Int_t *p_00;
  byte bVar1;
  int iVar2;
  uint uVar3;
  uint i;
  char *pcVar4;
  uint uVar5;
  int *piVar6;
  long lVar7;
  long lVar8;
  
  if ((p->vFanout).pArray != (int *)0x0) {
    __assert_fail("!Bac_NtkHasFanouts(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacNtk.c"
                  ,0xf4,"void Bac_NtkDeriveFanout(Bac_Ntk_t *)");
  }
  iVar2 = (p->vType).nCap;
  lVar8 = (long)iVar2;
  if (lVar8 == 0) {
    __assert_fail("Bac_NtkObjNumAlloc(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                  ,0xfd,"void Bac_NtkStartFanouts(Bac_Ntk_t *)");
  }
  p_00 = &p->vFanout;
  if ((p->vFanout).nCap < iVar2) {
    piVar6 = (int *)malloc(lVar8 * 4);
    (p->vFanout).pArray = piVar6;
    if (piVar6 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    p_00->nCap = iVar2;
  }
  else {
    piVar6 = (int *)0x0;
  }
  if (0 < iVar2) {
    memset(piVar6,0,lVar8 << 2);
  }
  (p->vFanout).nSize = iVar2;
  uVar5 = (p->vType).nSize;
  if (0 < (int)uVar5) {
    lVar8 = 0;
    do {
      pcVar4 = (p->vType).pArray;
      if ((pcVar4[lVar8] & 0xfcU) == 4) {
        uVar3 = (p->vFanout).nSize;
        if ((int)uVar3 <= lVar8) goto LAB_003ba4f2;
        piVar6 = (p->vFanout).pArray;
        if (piVar6[lVar8] != 0) {
          __assert_fail("!Bac_ObjNextFanout(p, iCo)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacNtk.c"
                        ,0xf8,"void Bac_NtkDeriveFanout(Bac_Ntk_t *)");
        }
        if ((p->vFanin).nSize <= lVar8) goto LAB_003ba4f2;
        i = (p->vFanin).pArray[lVar8];
        lVar7 = (long)(int)i;
        if ((lVar7 < 0) || (uVar5 <= i)) goto LAB_003ba511;
        bVar1 = pcVar4[lVar7];
        if ((9 < bVar1) || ((0x30cU >> (bVar1 & 0x1f) & 1) == 0)) {
LAB_003ba56e:
          __assert_fail("Bac_ObjIsCi(p, i)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                        ,0x125,"int Bac_ObjFanout(Bac_Ntk_t *, int)");
        }
        if (uVar3 <= i) goto LAB_003ba4f2;
        uVar3 = piVar6[lVar7];
        if ((ulong)uVar3 != 0) {
          if ((9 < bVar1) || ((0x30cU >> (bVar1 & 0x1f) & 1) == 0)) goto LAB_003ba56e;
          if (((int)uVar3 < 0) || (uVar5 <= uVar3)) goto LAB_003ba511;
          if ((pcVar4[uVar3] & 0xfcU) != 4) {
            __assert_fail("Bac_ObjIsCo(p, i)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                          ,0x128,"void Bac_ObjSetNextFanout(Bac_Ntk_t *, int, int)");
          }
          Vec_IntSetEntry(p_00,uVar3,(int)lVar8);
          uVar5 = (p->vType).nSize;
        }
        if ((int)uVar5 <= (int)i) goto LAB_003ba511;
        uVar5 = (uint)(byte)(p->vType).pArray[lVar7];
        if ((9 < uVar5) || ((0x30cU >> (uVar5 & 0x1f) & 1) == 0)) goto LAB_003ba58d;
        Vec_IntSetEntry(p_00,i,(int)lVar8);
        uVar5 = (p->vType).nSize;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < (int)uVar5);
    if (0 < (int)uVar5) {
      lVar8 = 0;
      do {
        pcVar4 = (p->vType).pArray;
        if ((pcVar4[lVar8] & 0xfcU) == 4) {
          if ((p->vFanout).nSize <= lVar8) goto LAB_003ba4f2;
          if ((p->vFanout).pArray[lVar8] == 0) {
            if ((p->vFanin).nSize <= lVar8) {
LAB_003ba4f2:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            uVar3 = (p->vFanin).pArray[lVar8];
            if (((long)(int)uVar3 < 0) || (uVar5 <= uVar3)) {
LAB_003ba511:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                            ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
            }
            uVar5 = (uint)(byte)pcVar4[(int)uVar3];
            if ((9 < uVar5) || ((0x30cU >> (uVar5 & 0x1f) & 1) == 0)) {
LAB_003ba58d:
              __assert_fail("Bac_ObjIsCi(p, i)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                            ,0x127,"void Bac_ObjSetFanout(Bac_Ntk_t *, int, int)");
            }
            Vec_IntSetEntry(p_00,uVar3,(int)lVar8);
            uVar5 = (p->vType).nSize;
          }
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < (int)uVar5);
    }
  }
  return;
}

Assistant:

void Bac_NtkDeriveFanout( Bac_Ntk_t * p )
{
    int iCi, iCo;
    assert( !Bac_NtkHasFanouts(p) );
    Bac_NtkStartFanouts( p );
    Bac_NtkForEachCo( p, iCo )
    {
        assert( !Bac_ObjNextFanout(p, iCo) );
        iCi = Bac_ObjFanin(p, iCo);
        if ( Bac_ObjFanout(p, iCi) )
            Bac_ObjSetNextFanout( p, Bac_ObjFanout(p, iCi), iCo );
        Bac_ObjSetFanout( p, iCi, iCo );
    }
    Bac_NtkForEachCo( p, iCo )
        if ( !Bac_ObjNextFanout(p, iCo) )
            Bac_ObjSetFanout( p, Bac_ObjFanin(p, iCo), iCo );
}